

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O3

void __thiscall HostVector_value_constructor_Test::TestBody(HostVector_value_constructor_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  long lVar6;
  void *__ptr;
  char *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  void *ptr;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40;
  undefined7 uStack_3f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  iVar5 = posix_memalign((void **)&local_40,8,0x28);
  auVar3 = _DAT_0014c360;
  auVar2 = _DAT_0014bb30;
  auVar1 = _DAT_0014bb20;
  lVar6 = 0;
  __ptr = (void *)0x0;
  if (iVar5 == 0) {
    __ptr = (void *)CONCAT71(uStack_3f,local_40);
  }
  do {
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar9 = (auVar8 | auVar1) ^ auVar2;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffff6) {
      *(undefined4 *)((long)__ptr + lVar6 * 4) = 0xfffffffb;
      *(undefined4 *)((long)__ptr + lVar6 * 4 + 4) = 0xfffffffb;
    }
    auVar8 = (auVar8 | auVar3) ^ auVar2;
    if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffff6) {
      *(undefined4 *)((long)__ptr + lVar6 * 4 + 8) = 0xfffffffb;
      *(undefined4 *)((long)__ptr + lVar6 * 4 + 0xc) = 0xfffffffb;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000a;
  local_48.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (&local_40,"v1.size()","10",(unsigned_long *)&local_50,(int *)&local_48);
  if (local_40 == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x75,pcVar7);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (((local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar6 = 0;
  do {
    local_50.ptr_._0_4_ = 0xfffffffb;
    testing::internal::CmpHelperEQ<int,int>
              (&local_40,"v1[i]","-5",(int *)((long)__ptr + lVar6),(int *)&local_50);
    if (local_40 == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar7 = "";
      if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x77,pcVar7);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x28);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

TEST(HostVector, value_constructor) {
    using namespace memory;

    HostVector<int> v1(10, -5);

    EXPECT_EQ(v1.size(), 10);
    for(auto i : v1.range()) {
        EXPECT_EQ(v1[i], -5);
    }
}